

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O0

void __thiscall Test::Assertion::Assertion(Assertion *this,char *fileName,uint32_t lineNum)

{
  char *__s;
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d [16];
  allocator<char> local_1d;
  uint32_t local_1c;
  char *pcStack_18;
  uint32_t lineNum_local;
  char *fileName_local;
  Assertion *this_local;
  
  local_1c = lineNum;
  pcStack_18 = fileName;
  fileName_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"",&local_1d);
  std::allocator<char>::~allocator(&local_1d);
  __s = pcStack_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->file,__s,local_2d);
  std::allocator<char>::~allocator(local_2d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->method,"",&local_2e);
  std::allocator<char>::~allocator(&local_2e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->args,"",&local_2f);
  std::allocator<char>::~allocator(&local_2f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->errorMessage,"",&local_30);
  std::allocator<char>::~allocator(&local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->userMessage,"",&local_31);
  std::allocator<char>::~allocator(&local_31);
  this->lineNumber = local_1c;
  return;
}

Assistant:

Assertion::Assertion(const char *fileName, uint32_t lineNum)
    : suite(""), file(fileName), method(""), args(""), errorMessage(""), userMessage(""), lineNumber(lineNum) {}